

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall LinkedObjectFile::find_functions(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  *this_00;
  bool bVar2;
  int iVar3;
  value_type vVar4;
  reference pvVar5;
  reference this_01;
  reference pvVar6;
  vector<Function,std::allocator<Function>> *this_02;
  reference pvVar7;
  int seg;
  size_type __n;
  int function_end;
  value_type local_48;
  value_type local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  pointer local_38;
  
  iVar3 = this->segments;
  local_40 = &this->offset_of_data_zone_by_seg;
  if (iVar3 == 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_40,0);
    if (*pvVar5 != 0) {
      __assert_fail("offset_of_data_zone_by_seg.at(0) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x171,"void LinkedObjectFile::find_functions()");
    }
  }
  else {
    this_00 = &this->functions_by_seg;
    for (__n = 0; (long)__n < (long)iVar3; __n = __n + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_40,__n);
      local_44 = *pvVar5;
      while (vVar4 = local_44, 0 < (int)local_44) {
        do {
          local_48 = vVar4 - 1;
          if ((int)vVar4 < 1) {
            __assert_fail("found_function_tag_loc",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                          ,0x187,"void LinkedObjectFile::find_functions()");
          }
          this_01 = std::
                    vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                    ::at(&this->words_by_seg,__n);
          pvVar6 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                             (this_01,(long)(int)local_48);
          vVar4 = local_48;
        } while ((pvVar6->kind != TYPE_PTR) ||
                (bVar2 = std::operator==(&pvVar6->symbol_name,"function"), vVar4 = local_48, !bVar2)
                );
        puVar1 = &(this->stats).function_count;
        *puVar1 = *puVar1 + 1;
        this_02 = (vector<Function,std::allocator<Function>> *)
                  std::
                  vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                  ::at(this_00,__n);
        std::vector<Function,std::allocator<Function>>::emplace_back<int&,int&>
                  (this_02,(int *)&local_48,(int *)&local_44);
        local_44 = local_48;
      }
      pvVar7 = std::
               vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ::at(this_00,__n);
      local_38 = (pvVar7->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pvVar7 = std::
               vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ::at(this_00,__n);
      std::
      __reverse<__gnu_cxx::__normal_iterator<Function*,std::vector<Function,std::allocator<Function>>>>
                (local_38,(pvVar7->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                          super__Vector_impl_data._M_finish);
      iVar3 = this->segments;
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::find_functions() {
  if (segments == 1) {
    // it's a v2 file, shouldn't have any functions
    assert(offset_of_data_zone_by_seg.at(0) == 0);
  } else {
    // we assume functions don't have any data in between them, so we use the "function" type tag to
    // mark the end of the previous function and the start of the next.  This means that some
    // functions will have a few 0x0 words after then for padding (GOAL functions are aligned), but
    // this is something that the disassembler should handle.
    for (int seg = 0; seg < segments; seg++) {
      // start at the end and work backward...
      int function_end = offset_of_data_zone_by_seg.at(seg);
      while (function_end > 0) {
        // back up until we find function type tag
        int function_tag_loc = function_end;
        bool found_function_tag_loc = false;
        for (; function_tag_loc-- > 0;) {
          auto& word = words_by_seg.at(seg).at(function_tag_loc);
          if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
            found_function_tag_loc = true;
            break;
          }
        }

        // mark this as a function, and try again from the current function start
        assert(found_function_tag_loc);
        stats.function_count++;
        functions_by_seg.at(seg).emplace_back(function_tag_loc, function_end);
        function_end = function_tag_loc;
      }

      std::reverse(functions_by_seg.at(seg).begin(), functions_by_seg.at(seg).end());
    }
  }
}